

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiIO::AddKeyAnalogEvent(ImGuiIO *this,ImGuiKey key,bool down,float analog_value)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ImGuiInputEvent *pIVar4;
  long lVar5;
  ImGuiContext *pIVar6;
  long lVar7;
  ImGuiKeyData *pIVar8;
  ImGuiInputEvent *__dest;
  int iVar9;
  ImGuiKeyData *pIVar10;
  float *pfVar11;
  long unaff_RBP;
  ImGuiContext *g;
  int iVar12;
  bool bVar13;
  
  pIVar6 = GImGui;
  if ((key != ImGuiKey_KeysData_OFFSET) && (this->AppAcceptingEvents == true)) {
    this->BackendUsingLegacyKeyArrays = '\0';
    if (key - ImGuiKey_GamepadStart < 0x18) {
      this->BackendUsingLegacyNavInputArray = false;
    }
    iVar2 = (pIVar6->InputEventsQueue).Size;
    lVar7 = (long)iVar2 + 1;
    lVar5 = (long)iVar2 * 0x18;
    do {
      if (lVar7 + -1 == 0 || lVar7 < 1) {
        unaff_RBP = 0;
        break;
      }
      pIVar4 = (pIVar6->InputEventsQueue).Data;
      bVar13 = true;
      if (*(int *)((long)&pIVar4[-1].Type + lVar5) == 4) {
        bVar13 = *(ImGuiKey *)((long)&pIVar4[-1].field_2 + lVar5) != key;
        if (!bVar13) {
          unaff_RBP = (long)&pIVar4[-1].Type + lVar5;
        }
      }
      lVar7 = lVar7 + -1;
      lVar5 = lVar5 + -0x18;
    } while (bVar13);
    pIVar8 = ImGui::GetKeyData(key);
    pIVar10 = (ImGuiKeyData *)(unaff_RBP + 0xc);
    if (unaff_RBP == 0) {
      pIVar10 = pIVar8;
    }
    if (pIVar10->Down == down) {
      pfVar11 = (float *)(unaff_RBP + 0x10);
      if (unaff_RBP == 0) {
        pfVar11 = &pIVar8->AnalogValue;
      }
      if ((*pfVar11 == analog_value) && (!NAN(*pfVar11) && !NAN(analog_value))) {
        return;
      }
    }
    iVar3 = (pIVar6->InputEventsQueue).Capacity;
    if (iVar2 == iVar3) {
      if (iVar3 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar3 / 2 + iVar3;
      }
      iVar12 = iVar2 + 1;
      if (iVar2 + 1 < iVar9) {
        iVar12 = iVar9;
      }
      if (iVar3 < iVar12) {
        if (pIVar6 != (ImGuiContext *)0x0) {
          piVar1 = &(pIVar6->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (ImGuiInputEvent *)
                 (*GImAllocatorAllocFunc)((long)iVar12 * 0x18,GImAllocatorUserData);
        pIVar4 = (pIVar6->InputEventsQueue).Data;
        if (pIVar4 != (ImGuiInputEvent *)0x0) {
          memcpy(__dest,pIVar4,(long)(pIVar6->InputEventsQueue).Size * 0x18);
          pIVar4 = (pIVar6->InputEventsQueue).Data;
          if ((pIVar4 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
        }
        (pIVar6->InputEventsQueue).Data = __dest;
        (pIVar6->InputEventsQueue).Capacity = iVar12;
      }
    }
    pIVar4 = (pIVar6->InputEventsQueue).Data;
    iVar2 = (pIVar6->InputEventsQueue).Size;
    pIVar4[iVar2].Type = ImGuiInputEventType_Key;
    pIVar4[iVar2].Source = (key - ImGuiKey_GamepadStart < 0x18) + ImGuiInputSource_Keyboard;
    pIVar4[iVar2].field_2.Key.Key = key;
    pIVar4[iVar2].field_2.MouseButton.Down = down;
    *(undefined2 *)((long)&pIVar4[iVar2].field_2 + 5) = 0;
    *(undefined1 *)((long)&pIVar4[iVar2].field_2 + 7) = 0;
    pIVar4[iVar2].field_2.Key.AnalogValue = analog_value;
    *(undefined4 *)&pIVar4[iVar2].AddedByTestEngine = 0;
    (pIVar6->InputEventsQueue).Size = (pIVar6->InputEventsQueue).Size + 1;
  }
  return;
}

Assistant:

void ImGuiIO::AddKeyAnalogEvent(ImGuiKey key, bool down, float analog_value)
{
    //if (e->Down) { IMGUI_DEBUG_LOG_IO("AddKeyEvent() Key='%s' %d, NativeKeycode = %d, NativeScancode = %d\n", ImGui::GetKeyName(e->Key), e->Down, e->NativeKeycode, e->NativeScancode); }
    if (key == ImGuiKey_None || !AppAcceptingEvents)
        return;
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    IM_ASSERT(ImGui::IsNamedKeyOrModKey(key)); // Backend needs to pass a valid ImGuiKey_ constant. 0..511 values are legacy native key codes which are not accepted by this API.
    IM_ASSERT(!ImGui::IsAliasKey(key)); // Backend cannot submit ImGuiKey_MouseXXX values they are automatically inferred from AddMouseXXX() events.

    // Verify that backend isn't mixing up using new io.AddKeyEvent() api and old io.KeysDown[] + io.KeyMap[] data.
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    IM_ASSERT((BackendUsingLegacyKeyArrays == -1 || BackendUsingLegacyKeyArrays == 0) && "Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!");
    if (BackendUsingLegacyKeyArrays == -1)
        for (int n = ImGuiKey_NamedKey_BEGIN; n < ImGuiKey_NamedKey_END; n++)
            IM_ASSERT(KeyMap[n] == -1 && "Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!");
    BackendUsingLegacyKeyArrays = 0;
#endif
    if (ImGui::IsGamepadKey(key))
        BackendUsingLegacyNavInputArray = false;

    // Filter duplicate (in particular: key mods and gamepad analog values are commonly spammed)
    const ImGuiInputEvent* latest_event = FindLatestInputEvent(ImGuiInputEventType_Key, (int)key);
    const ImGuiKeyData* key_data = ImGui::GetKeyData(key);
    const bool latest_key_down = latest_event ? latest_event->Key.Down : key_data->Down;
    const float latest_key_analog = latest_event ? latest_event->Key.AnalogValue : key_data->AnalogValue;
    if (latest_key_down == down && latest_key_analog == analog_value)
        return;

    // Add event
    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_Key;
    e.Source = ImGui::IsGamepadKey(key) ? ImGuiInputSource_Gamepad : ImGuiInputSource_Keyboard;
    e.Key.Key = key;
    e.Key.Down = down;
    e.Key.AnalogValue = analog_value;
    g.InputEventsQueue.push_back(e);
}